

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsMessageFree(HelicsMessage message)

{
  Message *this;
  HelicsMessage in_RDI;
  MessageHolder *messages;
  Message *mess;
  HelicsError *in_stack_fffffffffffffff0;
  
  this = getMessageObj(in_RDI,in_stack_fffffffffffffff0);
  if ((this != (Message *)0x0) && (this->backReference != (void *)0x0)) {
    helics::MessageHolder::freeMessage
              ((MessageHolder *)this,(int)((ulong)this->backReference >> 0x20));
  }
  return;
}

Assistant:

void helicsMessageFree(HelicsMessage message)
{
    auto* mess = getMessageObj(message, nullptr);
    if (mess == nullptr) {
        return;
    }
    auto* messages = reinterpret_cast<helics::MessageHolder*>(mess->backReference);
    if (messages == nullptr) {
        return;
    }
    messages->freeMessage(mess->counter);
}